

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

IndirOpnd * __thiscall
Lowerer::GenerateFastElemISymbolIndexCommon
          (Lowerer *this,Instr *elemInstr,bool isStore,IndirOpnd *indirOpnd,LabelInstr *labelHelper,
          FldInfoFlags flags)

{
  RegOpnd *baseOpnd;
  RegOpnd *srcReg;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IndirOpnd *pIVar4;
  undefined7 in_register_00000011;
  undefined7 in_register_00000089;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  undefined4 local_40;
  uint local_3c;
  LabelInstr *local_38;
  
  local_40 = (undefined4)CONCAT71(in_register_00000089,flags);
  local_3c = (uint)CONCAT71(in_register_00000011,isStore);
  baseOpnd = indirOpnd->m_baseOpnd;
  srcReg = indirOpnd->m_indexOpnd;
  if (baseOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    local_38 = labelHelper;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x40a1,"(baseOpnd != nullptr)","baseOpnd != nullptr");
    if (!bVar2) goto LAB_005dec6d;
    *puVar3 = 0;
    labelHelper = local_38;
  }
  local_42 = (srcReg->super_Opnd).m_valueType.field_0;
  bVar2 = ValueType::IsLikelySymbol((ValueType *)&local_42.field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    local_38 = labelHelper;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x40a2,"(indexOpnd->GetValueType().IsLikelySymbol())",
                       "indexOpnd->GetValueType().IsLikelySymbol()");
    if (!bVar2) {
LAB_005dec6d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    labelHelper = local_38;
  }
  GenerateSymbolTest(this,srcReg,elemInstr,labelHelper,(LabelInstr *)0x0,true);
  pIVar4 = GenerateFastElemISymbolOrStringIndexCommon
                     (this,elemInstr,srcReg,baseOpnd,(local_3c & 0xff) * 8 + 0x18,0x28,labelHelper,
                      (FldInfoFlags)local_40);
  return pIVar4;
}

Assistant:

IR::IndirOpnd*
Lowerer::GenerateFastElemISymbolIndexCommon(
    _In_ IR::Instr* elemInstr,
    _In_ bool isStore,
    _In_ IR::IndirOpnd* indirOpnd,
    _In_ IR::LabelInstr* labelHelper,
    _In_ Js::FldInfoFlags flags)
{
    IR::RegOpnd *indexOpnd = indirOpnd->GetIndexOpnd();
    IR::RegOpnd *baseOpnd = indirOpnd->GetBaseOpnd();
    Assert(baseOpnd != nullptr);
    Assert(indexOpnd->GetValueType().IsLikelySymbol());

    // Generates:
    //      SymbolTest(indexOpnd, $helper)                ; verify index is symbol type
    //      FastElemISymbolOrStringIndexCommon(indexOpnd, baseOpnd, $helper) ; shared code with PropertyString

    GenerateSymbolTest(indexOpnd, elemInstr, labelHelper);

    const uint32 inlineCacheOffset = isStore ? Js::JavascriptSymbol::GetOffsetOfStElemInlineCache() : Js::JavascriptSymbol::GetOffsetOfLdElemInlineCache();
    const uint32 hitRateOffset = Js::JavascriptSymbol::GetOffsetOfHitRate();

    return GenerateFastElemISymbolOrStringIndexCommon(elemInstr, indexOpnd, baseOpnd, inlineCacheOffset, hitRateOffset, labelHelper, flags);
}